

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O2

int testStorageReaderTestsTruncatedHeader(void)

{
  string *psVar1;
  ostream *poVar2;
  __uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  filename;
  initializer_list<unsigned_short> __l;
  Span<unsigned_short,_18446744073709551615UL> data;
  allocator_type local_89;
  StorageReader reader;
  pointer local_80;
  string local_70;
  unsigned_short local_50 [4];
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 2;
  local_50[3] = 0;
  __l._M_len = 4;
  __l._M_array = local_50;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&reader,__l,&local_89);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  filename._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
        )(_Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>)0x0;
  if ((long)local_80 -
      (long)reader.m_impl._M_t.
            super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
            .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl != 0) {
    filename._M_t.
    super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
    .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
         (tuple<MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
          )(tuple<MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
            )reader;
  }
  data.m_ptr = (pointer)((long)local_80 -
                         (long)reader.m_impl._M_t.
                               super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
                               .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>.
                               _M_head_impl >> 1);
  data.m_size.m_size =
       (size_t)reader.m_impl._M_t.
               super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
               .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,18446744073709551615ul>
            ((TestUtil *)psVar1,
             (string *)
             filename._M_t.
             super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
             .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl,data);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&reader);
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&reader,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  MILBlob::Blob::StorageReader::GetDataView<float>(&reader,0x28);
  poVar2 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x42);
  std::operator<<(poVar2,": expected exception, but none thrown.\n");
  MILBlob::Blob::StorageReader::~StorageReader(&reader);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testStorageReaderTestsTruncatedHeader()
{
    AutoDeleteTempFile tempfile;

    {
        // count=0, version=2
        std::vector<uint16_t> bytes{0x0000, 0x0000, 0x0002, 0x0000};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(bytes));
    }

    StorageReader reader(tempfile.GetFilename());
    ML_ASSERT_THROWS_WITH_MESSAGE(reader.GetDataView<float>(40), std::range_error, "index out of bounds");

    return 0;
}